

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint __thiscall ON_SubDMeshFragmentGrid::GridId(ON_SubDMeshFragmentGrid *this)

{
  uint local_2c;
  uint local_1c;
  uint lod;
  uint id;
  ON_SubDMeshFragmentGrid *this_local;
  
  do {
    if (this->m_F != (uint *)0x0) {
      return 0;
    }
    for (local_1c = 0; local_1c < 0x11; local_1c = local_1c + 2) {
      if (1 << ((byte)local_1c & 0x1f) == (uint)this->m_F_count) {
        local_1c = local_1c >> 1;
        local_2c = local_1c;
        if (this->m_F_level_of_detail <= local_1c) {
          local_2c = (uint)this->m_F_level_of_detail;
        }
        return local_1c * 0x20 + local_2c * 2;
      }
    }
  } while( true );
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::GridId() const
{
  for (;;)
  {
    if (nullptr != m_F)
      break;

    // m_F_count = 2^(2n)
    for (unsigned int id = 0; id <= 16; id += 2)
    {
      if ((1U << id) == m_F_count)
      {
        id /= 2; // id = "n"
        unsigned int lod = (m_F_level_of_detail > id) ? id : (unsigned int)m_F_level_of_detail;
        id = 32*id + 2*lod;
        return id;
      }
    }
  }

  return 0;
}